

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O0

bool vkt::geometry::compareWithFileImage
               (Context *context,ConstPixelBufferAccess *resultImage,string *testName)

{
  bool bVar1;
  TestContext *pTVar2;
  Archive *archive;
  char *fileName_00;
  TestLog *pTVar3;
  Vector<int,_3> local_10c;
  Vector<unsigned_int,_4> local_100;
  ConstPixelBufferAccess local_f0;
  ConstPixelBufferAccess local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string fileName;
  TextureLevel referenceImage;
  string *testName_local;
  ConstPixelBufferAccess *resultImage_local;
  Context *context_local;
  
  tcu::TextureLevel::TextureLevel((TextureLevel *)((long)&fileName.field_2 + 8));
  std::operator+(&local_90,"vulkan/data/geometry/",testName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,".png");
  std::__cxx11::string::~string((string *)&local_90);
  pTVar2 = Context::getTestContext(context);
  archive = tcu::TestContext::getArchive(pTVar2);
  fileName_00 = (char *)std::__cxx11::string::c_str();
  tcu::ImageIO::loadPNG((TextureLevel *)((long)&fileName.field_2 + 8),archive,fileName_00);
  pTVar2 = Context::getTestContext(context);
  pTVar3 = tcu::TestContext::getLog(pTVar2);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_c8,(TextureLevel *)((long)&fileName.field_2 + 8));
  bVar1 = tcu::fuzzyCompare(pTVar3,"ImageComparison","Image Comparison",&local_c8,resultImage,0.001,
                            COMPARE_LOG_RESULT);
  if (bVar1) {
    pTVar2 = Context::getTestContext(context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&local_f0,(TextureLevel *)((long)&fileName.field_2 + 8));
    tcu::Vector<unsigned_int,_4>::Vector(&local_100,1,1,1,1);
    tcu::Vector<int,_3>::Vector(&local_10c,2,2,2);
    context_local._7_1_ =
         tcu::intThresholdPositionDeviationCompare
                   (pTVar3,"ImageComparison","Image Comparison",&local_f0,resultImage,&local_100,
                    &local_10c,false,COMPARE_LOG_RESULT);
  }
  else {
    context_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_70);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)((long)&fileName.field_2 + 8));
  return context_local._7_1_;
}

Assistant:

bool compareWithFileImage (Context& context, const tcu::ConstPixelBufferAccess& resultImage, std::string testName)
{
	tcu::TextureLevel referenceImage;
	std::string fileName="vulkan/data/geometry/"+testName+".png";
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), fileName.c_str());

	if (tcu::fuzzyCompare(context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
								referenceImage.getAccess(), resultImage, 0.001f, tcu::COMPARE_LOG_RESULT))
		return tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
														referenceImage.getAccess(), resultImage, tcu::UVec4(1u, 1u, 1u, 1u), tcu::IVec3(2,2,2), false, tcu::COMPARE_LOG_RESULT);
	else
		return false;
}